

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::scrollTo(QTreeView *this,QModelIndex *index,ScrollHint hint)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  bool bVar3;
  State SVar4;
  ScrollMode SVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QTreeViewPrivate *this_00;
  ulong uVar10;
  int in_EDX;
  QModelIndex *in_RSI;
  long in_FS_OFFSET;
  int cellWidth;
  int horizontalPosition;
  int horizontalOffset;
  int viewportWidth;
  int verticalValue;
  bool below;
  bool above;
  int y;
  int currentItemHeight;
  int bottom;
  int top;
  int item;
  QTreeViewPrivate *d;
  QRect rect;
  QRect area;
  QModelIndex parent;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff00;
  QHeaderView *this_01;
  QWidget *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff3c;
  int local_bc;
  byte local_b1;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_8c;
  int local_7c;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8f37e5);
  bVar3 = QAbstractItemViewPrivate::isIndexValid
                    ((QAbstractItemViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (QModelIndex *)in_stack_ffffffffffffff08);
  if (bVar3) {
    QAbstractItemViewPrivate::executePostedLayout(in_stack_ffffffffffffff00);
    QTreeViewPrivate::updateScrollBars(this_00);
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::parent((QModelIndex *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                       );
    while( true ) {
      bVar3 = ::operator!=((QModelIndex *)in_stack_ffffffffffffff00,
                           (QPersistentModelIndex *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      local_b1 = 0;
      if (bVar3) {
        bVar3 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff00);
        local_b1 = 0;
        if (bVar3) {
          SVar4 = QAbstractItemView::state((QAbstractItemView *)in_stack_ffffffffffffff00);
          local_b1 = 0;
          if (SVar4 == NoState) {
            local_b1 = this_00->itemsExpandable;
          }
        }
      }
      if ((local_b1 & 1) == 0) break;
      bVar3 = isExpanded((QTreeView *)in_stack_ffffffffffffff00,
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (!bVar3) {
        expand((QTreeView *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,
                                 CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))),
               (QModelIndex *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar1 + 0x68))(&local_38,pQVar1,&local_20);
      local_20 = local_38;
      local_18 = local_30;
      local_10 = local_28;
    }
    local_7c = QTreeViewPrivate::viewIndex
                         ((QTreeViewPrivate *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (QModelIndex *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (-1 < local_7c) {
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = (undefined1  [16])
                 QWidget::rect((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      SVar5 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)in_stack_ffffffffffffff00);
      if (SVar5 == ScrollPerItem) {
        QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff00);
        iVar6 = QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffff00);
        QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff00);
        iVar7 = QAbstractSlider::pageStep((QAbstractSlider *)in_stack_ffffffffffffff00);
        if (((in_EDX != 0) || (local_7c < iVar6)) || (iVar6 + iVar7 <= local_7c)) {
          if ((in_EDX == 1) || ((in_EDX == 0 && (local_7c < iVar6)))) {
            QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff00)
            ;
            QAbstractSlider::setValue
                      ((QAbstractSlider *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       in_stack_ffffffffffffff14);
          }
          else {
            iVar6 = QTreeViewPrivate::itemHeight
                              ((QTreeViewPrivate *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                               in_stack_ffffffffffffff14);
            if (in_EDX == 3) {
              iVar7 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                      in_stack_fffffffffffffef8));
              local_bc = iVar7 / 2 + iVar6 + -1;
            }
            else {
              local_bc = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                         in_stack_fffffffffffffef8));
            }
            local_8c = local_bc;
            if (iVar6 < local_bc) {
              for (; -1 < local_7c; local_7c = local_7c + -1) {
                iVar6 = QTreeViewPrivate::itemHeight
                                  ((QTreeViewPrivate *)
                                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                   in_stack_ffffffffffffff14);
                local_8c = local_8c - iVar6;
                if (local_8c < 0) break;
              }
            }
            QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff00)
            ;
            QAbstractSlider::setValue
                      ((QAbstractSlider *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       in_stack_ffffffffffffff14);
          }
        }
      }
      else {
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::column(in_RSI);
        iVar6 = columnViewportPosition
                          ((QTreeView *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        QTreeViewPrivate::coordinateForItem
                  ((QTreeViewPrivate *)CONCAT44(in_stack_ffffffffffffff3c,iVar6),
                   CONCAT13(in_stack_ffffffffffffff37,
                            CONCAT12(in_stack_ffffffffffffff36,in_stack_ffffffffffffff34)));
        QModelIndex::column(in_RSI);
        columnWidth((QTreeView *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        QTreeViewPrivate::itemHeight
                  ((QTreeViewPrivate *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                   ,in_stack_ffffffffffffff14);
        QRect::QRect((QRect *)in_stack_ffffffffffffff08,
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(int)in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
        bVar3 = QRect::isEmpty((QRect *)in_stack_ffffffffffffff00);
        if (!bVar3) {
          if ((in_EDX == 0) &&
             (uVar10 = QRect::contains((QRect *)local_48,SUB81(&local_58,0)), (uVar10 & 1) != 0)) {
            QWidget::update(in_stack_ffffffffffffff08,(QRect *)in_stack_ffffffffffffff00);
          }
          else {
            bVar3 = false;
            if (in_EDX == 0) {
              iVar6 = QRect::top((QRect *)0x8f3ca4);
              iVar7 = QRect::top((QRect *)0x8f3cb5);
              bVar3 = true;
              if (iVar7 <= iVar6) {
                iVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                        in_stack_fffffffffffffef8));
                iVar7 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                        in_stack_fffffffffffffef8));
                bVar3 = iVar6 < iVar7;
              }
            }
            bVar2 = false;
            if (in_EDX == 0) {
              iVar6 = QRect::bottom((QRect *)0x8f3d21);
              iVar7 = QRect::bottom((QRect *)0x8f3d32);
              bVar2 = false;
              if (iVar7 < iVar6) {
                iVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                        in_stack_fffffffffffffef8));
                iVar7 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                        in_stack_fffffffffffffef8));
                bVar2 = iVar6 < iVar7;
              }
            }
            QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff00)
            ;
            QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffff00);
            if ((in_EDX == 1) || (bVar3)) {
              QRect::top((QRect *)0x8f3dad);
            }
            else if ((in_EDX == 2) || (bVar2)) {
              in_stack_ffffffffffffff1c = QRect::bottom((QRect *)0x8f3dd8);
              QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            }
            else if (in_EDX == 3) {
              in_stack_ffffffffffffff18 = QRect::top((QRect *)0x8f3e12);
              in_stack_ffffffffffffff14 =
                   QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                   in_stack_fffffffffffffef8));
              QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            }
            QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff00)
            ;
            QAbstractSlider::setValue
                      ((QAbstractSlider *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       in_stack_ffffffffffffff14);
          }
        }
      }
      iVar6 = QWidget::width((QWidget *)0x8f3e86);
      iVar7 = QHeaderView::offset((QHeaderView *)in_stack_ffffffffffffff00);
      this_01 = this_00->header;
      QModelIndex::column(in_RSI);
      iVar8 = QHeaderView::sectionPosition
                        ((QHeaderView *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         in_stack_ffffffffffffff14);
      QModelIndex::column(in_RSI);
      iVar9 = QHeaderView::sectionSize
                        ((QHeaderView *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         in_stack_ffffffffffffff14);
      if (in_EDX == 3) {
        QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this_01);
        QAbstractSlider::setValue
                  ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff14);
      }
      else if ((iVar8 - iVar7 < 0) || (iVar6 < iVar9)) {
        QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this_01);
        QAbstractSlider::setValue
                  ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff14);
      }
      else if (iVar6 < (iVar8 - iVar7) + iVar9) {
        QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this_01);
        QAbstractSlider::setValue
                  ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff14);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QTreeView);

    if (!d->isIndexValid(index))
        return;

    d->executePostedLayout();
    d->updateScrollBars();

    // Expand all parents if the parent(s) of the node are not expanded.
    QModelIndex parent = index.parent();
    while (parent != d->root && parent.isValid() && state() == NoState && d->itemsExpandable) {
        if (!isExpanded(parent))
            expand(parent);
        parent = d->model->parent(parent);
    }

    int item = d->viewIndex(index);
    if (item < 0)
        return;

    QRect area = d->viewport->rect();

    // vertical
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        int top = verticalScrollBar()->value();
        int bottom = top + verticalScrollBar()->pageStep();
        if (hint == EnsureVisible && item >= top && item < bottom) {
            // nothing to do
        } else if (hint == PositionAtTop || (hint == EnsureVisible && item < top)) {
            verticalScrollBar()->setValue(item);
        } else { // PositionAtBottom or PositionAtCenter
            const int currentItemHeight = d->itemHeight(item);
            int y = (hint == PositionAtCenter
                 //we center on the current item with a preference to the top item (ie. -1)
                     ? area.height() / 2 + currentItemHeight - 1
                 //otherwise we simply take the whole space
                     : area.height());
            if (y > currentItemHeight) {
                while (item >= 0) {
                    y -= d->itemHeight(item);
                    if (y < 0) { //there is no more space left
                        item++;
                        break;
                    }
                    item--;
                }
            }
            verticalScrollBar()->setValue(item);
        }
    } else { // ScrollPerPixel
        QRect rect(columnViewportPosition(index.column()),
                   d->coordinateForItem(item), // ### slow for items outside the view
                   columnWidth(index.column()),
                   d->itemHeight(item));

        if (rect.isEmpty()) {
            // nothing to do
        } else if (hint == EnsureVisible && area.contains(rect)) {
            d->viewport->update(rect);
            // nothing to do
        } else {
            bool above = (hint == EnsureVisible
                        && (rect.top() < area.top()
                            || area.height() < rect.height()));
            bool below = (hint == EnsureVisible
                        && rect.bottom() > area.bottom()
                        && rect.height() < area.height());

            int verticalValue = verticalScrollBar()->value();
            if (hint == PositionAtTop || above)
                verticalValue += rect.top();
            else if (hint == PositionAtBottom || below)
                verticalValue += rect.bottom() - area.height();
            else if (hint == PositionAtCenter)
                verticalValue += rect.top() - ((area.height() - rect.height()) / 2);
            verticalScrollBar()->setValue(verticalValue);
        }
    }
    // horizontal
    int viewportWidth = d->viewport->width();
    int horizontalOffset = d->header->offset();
    int horizontalPosition = d->header->sectionPosition(index.column());
    int cellWidth = d->header->sectionSize(index.column());

    if (hint == PositionAtCenter) {
        horizontalScrollBar()->setValue(horizontalPosition - ((viewportWidth - cellWidth) / 2));
    } else {
        if (horizontalPosition - horizontalOffset < 0 || cellWidth > viewportWidth)
            horizontalScrollBar()->setValue(horizontalPosition);
        else if (horizontalPosition - horizontalOffset + cellWidth > viewportWidth)
            horizontalScrollBar()->setValue(horizontalPosition - viewportWidth + cellWidth);
    }
}